

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

void __thiscall llvm::sys::fs::TempFile::TempFile(TempFile *this,StringRef Name,int FD)

{
  int FD_local;
  TempFile *this_local;
  StringRef Name_local;
  
  Name_local.Data = (char *)Name.Length;
  this_local = (TempFile *)Name.Data;
  this->Done = false;
  StringRef::operator_cast_to_string(&this->TmpName,(StringRef *)&this_local);
  this->FD = FD;
  return;
}

Assistant:

TempFile::TempFile(StringRef Name, int FD) : TmpName(Name), FD(FD) {}